

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfactoryloader.cpp
# Opt level: O2

QMultiMap<int,_QString> __thiscall QFactoryLoader::keyMap(QFactoryLoader *this)

{
  QCborContainerPrivate *pQVar1;
  QCborValueConstRef QVar2;
  long lVar3;
  QFactoryLoader *in_RSI;
  long in_FS_OFFSET;
  QCborValueConstRef QVar4;
  QArrayDataPointer<char16_t> local_a8;
  QArrayDataPointer<char16_t> local_88;
  QCborValueConstRef local_70;
  int local_5c;
  QArrayDataPointer<QCborArray> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).iid.d.d = (Data *)0x0;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QCborArray *)&DAT_aaaaaaaaaaaaaaaa;
  metaDataKeys((QList<QCborArray> *)&local_58,in_RSI);
  for (local_5c = 0; local_5c < (int)local_58.size; local_5c = local_5c + 1) {
    pQVar1 = local_58.ptr[local_5c].d.d.ptr;
    QVar4 = (QCborValueConstRef)QCborArray::constEnd(local_58.ptr + local_5c);
    for (lVar3 = 0; QVar2.i = lVar3, QVar2.d = pQVar1, QVar4 != QVar2; lVar3 = lVar3 + 1) {
      local_a8.d = (Data *)0x0;
      local_a8.ptr = (char16_t *)0x0;
      local_a8.size = 0;
      local_70.d = pQVar1;
      local_70.i = lVar3;
      QCborValueConstRef::toString((QString *)&local_88,&local_70,(QString *)&local_a8);
      QMultiMap<int,_QString>::insert
                ((QMultiMap<int,_QString> *)this,&local_5c,(QString *)&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a8);
    }
  }
  QArrayDataPointer<QCborArray>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
            )(QExplicitlySharedDataPointerV2<QMapData<std::multimap<int,_QString,_std::less<int>,_std::allocator<std::pair<const_int,_QString>_>_>_>_>
              )this;
  }
  __stack_chk_fail();
}

Assistant:

QMultiMap<int, QString> QFactoryLoader::keyMap() const
{
    QMultiMap<int, QString> result;
    const QList<QCborArray> metaDataList = metaDataKeys();
    for (int i = 0; i < int(metaDataList.size()); ++i) {
        const QCborArray &keys = metaDataList[i];
        for (QCborValueConstRef key : keys)
            result.insert(i, key.toString());
    }
    return result;
}